

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O2

bool __thiscall ParsedJson::allocateCapacity(ParsedJson *this,size_t len,size_t maxdepth)

{
  ulong uVar1;
  ostream *poVar2;
  uint32_t *puVar3;
  uint8_t *puVar4;
  uint64_t *puVar5;
  uint32_t *puVar6;
  void **ppvVar7;
  ulong uVar8;
  
  if (len == 0 || maxdepth == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"capacities must be non-zero ");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    if ((len <= this->bytecapacity) && (this->depthcapacity < maxdepth)) {
      return true;
    }
    deallocate(this);
    this->isvalid = false;
    this->bytecapacity = 0;
    this->n_structural_indexes = 0;
    uVar1 = len + 0x3f;
    puVar3 = (uint32_t *)
             operator_new__((ulong)((uint)uVar1 & 0xffffffc0) * 4 + 0x24,(nothrow_t *)&std::nothrow)
    ;
    this->structural_indexes = puVar3;
    uVar8 = len + 0x5f & 0xffffffffffffffc0;
    puVar4 = (uint8_t *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
    this->string_buf = puVar4;
    puVar5 = (uint64_t *)
             operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | (uVar1 & 0xffffffffffffffc0) * 8,
                            (nothrow_t *)&std::nothrow);
    this->tape = puVar5;
    puVar6 = (uint32_t *)
             operator_new__(-(ulong)(maxdepth >> 0x3e != 0) | maxdepth * 4,
                            (nothrow_t *)&std::nothrow);
    this->containing_scope_offset = puVar6;
    ppvVar7 = (void **)operator_new__(-(ulong)(maxdepth >> 0x3d != 0) | maxdepth * 8,
                                      (nothrow_t *)&std::nothrow);
    this->ret_address = ppvVar7;
    if ((((puVar3 != (uint32_t *)0x0) && (puVar4 != (uint8_t *)0x0)) && (puVar5 != (uint64_t *)0x0))
       && ((puVar6 != (uint32_t *)0x0 && (ppvVar7 != (void **)0x0)))) {
      this->bytecapacity = len;
      this->depthcapacity = maxdepth;
      this->tapecapacity = uVar1 & 0xffffffffffffffc0;
      this->stringcapacity = uVar8;
      return true;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Could not allocate memory");
    std::endl<char,std::char_traits<char>>(poVar2);
    if (this->ret_address != (void **)0x0) {
      operator_delete__(this->ret_address);
    }
    if (this->containing_scope_offset != (uint32_t *)0x0) {
      operator_delete__(this->containing_scope_offset);
    }
    if (this->tape != (uint64_t *)0x0) {
      operator_delete__(this->tape);
    }
    if (this->string_buf != (uint8_t *)0x0) {
      operator_delete__(this->string_buf);
    }
    if (this->structural_indexes != (uint32_t *)0x0) {
      operator_delete__(this->structural_indexes);
    }
  }
  return false;
}

Assistant:

WARN_UNUSED
bool ParsedJson::allocateCapacity(size_t len, size_t maxdepth) {
    if ((maxdepth == 0) || (len == 0)) {
      std::cerr << "capacities must be non-zero " << std::endl;
      return false;
    }
    if (len > 0) {
      if ((len <= bytecapacity) && (depthcapacity < maxdepth)) {
        return true;
}
      deallocate();
    }
    isvalid = false;
    bytecapacity = 0; // will only set it to len after allocations are a success
    n_structural_indexes = 0;
    uint32_t max_structures = ROUNDUP_N(len, 64) + 2 + 7;
    structural_indexes = new (std::nothrow) uint32_t[max_structures];
    size_t localtapecapacity = ROUNDUP_N(len, 64);
    size_t localstringcapacity = ROUNDUP_N(len + 32, 64);
    string_buf = new (std::nothrow) uint8_t[localstringcapacity];
    tape = new (std::nothrow) uint64_t[localtapecapacity];
    containing_scope_offset = new (std::nothrow) uint32_t[maxdepth];
#ifdef SIMDJSON_USE_COMPUTED_GOTO
    ret_address = new (std::nothrow) void *[maxdepth];
#else
    ret_address = new (std::nothrow) char[maxdepth];
#endif
    if ((string_buf == nullptr) || (tape == nullptr) ||
        (containing_scope_offset == nullptr) || (ret_address == nullptr) || (structural_indexes == nullptr)) {
      std::cerr << "Could not allocate memory" << std::endl;
      delete[] ret_address;
      delete[] containing_scope_offset;
      delete[] tape;
      delete[] string_buf;
      delete[] structural_indexes;

      return false;
    }

    bytecapacity = len;
    depthcapacity = maxdepth;
    tapecapacity = localtapecapacity;
    stringcapacity = localstringcapacity;
    return true;
}